

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O0

void __thiscall QToolButton::paintEvent(QToolButton *this,QPaintEvent *param_2)

{
  long *in_RDI;
  long in_FS_OFFSET;
  QStylePainter p;
  QStyleOptionToolButton opt;
  ComplexControl in_stack_fffffffffffffeec;
  QStyleOptionToolButton *this_00;
  QWidget *in_stack_fffffffffffffef8;
  QStylePainter *in_stack_ffffffffffffff00;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  QStyleOptionToolButton *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QStyleOptionToolButton *)&DAT_aaaaaaaaaaaaaaaa;
  QStylePainter::QStylePainter(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = this_00;
  QStyleOptionToolButton::QStyleOptionToolButton((QStyleOptionToolButton *)0x709b1c);
  (**(code **)(*in_RDI + 0x1b8))(in_RDI,&local_a8);
  QStylePainter::drawComplexControl
            ((QStylePainter *)this_00,in_stack_fffffffffffffeec,(QStyleOptionComplex *)0x709b46);
  QStyleOptionToolButton::~QStyleOptionToolButton(this_00);
  QStylePainter::~QStylePainter((QStylePainter *)0x709b5a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolButton::paintEvent(QPaintEvent *)
{
    QStylePainter p(this);
    QStyleOptionToolButton opt;
    initStyleOption(&opt);
    p.drawComplexControl(QStyle::CC_ToolButton, opt);
}